

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O3

Instrument * Timidity::load_instrument_dls(Renderer *song,int drum,int bank,int instrument)

{
  DLS_Instrument *pDVar1;
  int *piVar2;
  undefined8 uVar3;
  uint uVar4;
  DLS_Data *pDVar5;
  DLS_Wave *pDVar6;
  DLS_Region *pDVar7;
  uint *puVar8;
  long lVar9;
  WaveFMT *pWVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Sample *pSVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  Instrument *pIVar23;
  Instrument *pIVar24;
  uint uVar25;
  long lVar26;
  Instrument *pIVar27;
  DLS_Instrument *pDVar28;
  DLS_Instrument *pDVar29;
  CONNECTION *artList;
  long lVar30;
  ULONG UVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  Instrument *local_80;
  
  pDVar5 = song->patches;
  local_80 = (Instrument *)0x0;
  if (pDVar5 != (DLS_Data *)0x0) {
    uVar22 = pDVar5->cInstruments;
    pIVar27 = (Instrument *)(ulong)uVar22;
    if (pIVar27 == (Instrument *)0x0) {
      pDVar29 = (DLS_Instrument *)0x0;
    }
    else {
      uVar25 = (uint)(drum != 0) * -0x80000000;
      pDVar28 = pDVar5->instruments;
      pDVar1 = pDVar28 + (uVar22 - 1);
      pIVar23 = (Instrument *)0x0;
      do {
        uVar4 = (pDVar28->header->Locale).ulBank;
        if ((((uVar4 & 0x80000000) == uVar25) && ((uVar4 >> 8 & 0xff) == bank)) &&
           (pIVar24 = pIVar23, pDVar29 = pDVar28,
           (pDVar28->header->Locale).ulInstrument == instrument)) break;
        pIVar23 = (Instrument *)((long)&pIVar23->samples + 1);
        pDVar28 = pDVar28 + 1;
        pIVar24 = pIVar27;
        pDVar29 = pDVar1;
      } while (pIVar27 != pIVar23);
      local_80 = (Instrument *)0x0;
      if (bank == 0 && (uint)pIVar24 == uVar22) {
        if (uVar22 != 0) {
          pDVar29 = pDVar5->instruments;
          local_80 = (Instrument *)0x0;
          while ((((pDVar29->header->Locale).ulBank & 0x80000000) != uVar25 ||
                 ((pDVar29->header->Locale).ulInstrument != instrument))) {
            local_80 = (Instrument *)((long)&local_80->samples + 1);
            pDVar29 = pDVar29 + 1;
            if (pIVar27 == local_80) {
              return (Instrument *)0x0;
            }
          }
        }
      }
      else {
        local_80 = (Instrument *)((ulong)pIVar24 & 0xffffffff);
      }
    }
    if ((uint)local_80 == uVar22) {
      local_80 = (Instrument *)0x0;
    }
    else {
      local_80 = (Instrument *)safe_malloc(0x10);
      UVar31 = pDVar29->header->cRegions;
      local_80->samples = UVar31;
      pSVar19 = (Sample *)safe_malloc((long)(int)UVar31 * 0x68);
      local_80->sample = pSVar19;
      memset(pSVar19,0,(long)local_80->samples * 0x68);
      if (pDVar29->header->cRegions != 0) {
        lVar26 = 0x28;
        lVar30 = 0;
        uVar21 = 0;
        do {
          pSVar19 = local_80->sample;
          pDVar6 = song->patches->waveList;
          pDVar7 = pDVar29->regions;
          uVar22 = *(uint *)(*(long *)((long)pDVar7 + lVar26 + -0x20) + 8);
          (&pSVar19->type)[lVar30] = '\x01';
          puVar8 = *(uint **)((long)pDVar7 + lVar26 + -0x28);
          (&pSVar19->self_nonexclusive)[lVar30] = (bool)((byte)puVar8[2] & 1);
          *(short *)((long)&pSVar19->key_group + lVar30) = (short)*(char *)((long)puVar8 + 10);
          uVar25 = *puVar8;
          auVar34._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
          auVar34._4_2_ = (short)(uVar25 >> 0x10);
          auVar34._0_4_ = uVar25;
          dVar32 = exp2((double)(uVar25 & 0xffff) * 0.08333333333333333);
          dVar33 = exp2((double)auVar34._4_4_ * 0.08333333333333333);
          *(ulong *)((long)&pSVar19->low_freq + lVar30) =
               CONCAT44((float)(dVar33 * 8175.798947309669),(float)(dVar32 * 8175.798947309669));
          lVar9 = *(long *)((long)pDVar7 + lVar26 + -0x18);
          dVar32 = exp2((double)((float)(int)*(short *)(lVar9 + 6) * 0.01 +
                                (float)*(ushort *)(lVar9 + 4)) * 0.08333333333333333);
          *(float *)((long)&pSVar19->root_freq + lVar30) = (float)(dVar32 * 8175.798947309669);
          (&pSVar19->low_vel)[lVar30] = (BYTE)puVar8[1];
          (&pSVar19->high_vel)[lVar30] = *(BYTE *)((long)puVar8 + 6);
          pWVar10 = pDVar6[uVar22].format;
          *(ushort *)((long)&pSVar19->modes + lVar30) = (pWVar10->wBitsPerSample == 8) + 1;
          *(DWORD *)((long)&pSVar19->sample_rate + lVar30) = pWVar10->dwSamplesPerSec;
          *(undefined8 *)((long)&pSVar19->data + lVar30) = 0;
          *(DWORD *)((long)&pSVar19->data_length + lVar30) = pDVar6[uVar22].length;
          convert_sample_data((Sample *)((long)&pSVar19->loop_start + lVar30),pDVar6[uVar22].data);
          lVar9 = *(long *)((long)pDVar7 + lVar26 + -0x18);
          uVar12 = *(ushort *)((long)&pSVar19->modes + lVar30);
          if (*(int *)(lVar9 + 0x10) != 0) {
            uVar12 = uVar12 | 0x24;
            *(ushort *)((long)&pSVar19->modes + lVar30) = uVar12;
            lVar11 = *(long *)((long)pDVar7 + lVar26 + -0x10);
            uVar22 = *(uint *)(lVar11 + 8) >> 1;
            *(uint *)((long)&pSVar19->loop_start + lVar30) = uVar22;
            *(uint *)((long)&pSVar19->loop_end + lVar30) = (*(uint *)(lVar11 + 0xc) >> 1) + uVar22;
          }
          *(undefined2 *)((long)&pSVar19->scale_factor + lVar30) = 0x400;
          *(undefined2 *)((long)&pSVar19->scale_note + lVar30) = *(undefined2 *)(lVar9 + 4);
          if ((uVar12 & 0x20) != 0) {
            if (((pDVar29->art == (CONNECTIONLIST *)0x0) ||
                (UVar31 = pDVar29->art->cConnections, UVar31 == 0)) ||
               (artList = pDVar29->artList, artList == (CONNECTION *)0x0)) {
              artList = *(CONNECTION **)((long)&pDVar7->header + lVar26);
              UVar31 = *(ULONG *)(*(long *)((long)pDVar7 + lVar26 + -8) + 4);
            }
            iVar13 = load_connection(UVar31,artList,0x206);
            iVar14 = load_connection(UVar31,artList,0x20c);
            iVar15 = load_connection(UVar31,artList,0x207);
            iVar16 = load_connection(UVar31,artList,0x209);
            iVar17 = load_connection(UVar31,artList,0x20a);
            iVar18 = load_connection(UVar31,artList,4);
            iVar20 = iVar18 + 0xffff;
            if (-1 < iVar18) {
              iVar20 = iVar18;
            }
            *(short *)((long)&pSVar19->panning + lVar30) =
                 (short)(int)((double)(iVar20 >> 0x10) * 16.383 + 8191.5);
            *(undefined2 *)((long)&pSVar19->envelope + lVar30) = 0x8000;
            *(short *)((long)&pSVar19->envelope + lVar30 + 2) = (short)((uint)iVar13 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar30 + 4) = (short)((uint)iVar14 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar30 + 6) = (short)((uint)iVar15 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar30 + 10) = (short)((uint)iVar16 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar30 + 8) = (short)((uint)iVar17 >> 0x10);
          }
          piVar2 = (int *)((long)&pSVar19->data_length + lVar30);
          *piVar2 = *piVar2 << 0xc;
          uVar3 = *(undefined8 *)((long)&pSVar19->loop_start + lVar30);
          *(ulong *)((long)&pSVar19->loop_start + lVar30) =
               CONCAT44((int)((ulong)uVar3 >> 0x20) << 0xc,(int)uVar3 << 0xc);
          uVar21 = uVar21 + 1;
          lVar30 = lVar30 + 0x68;
          lVar26 = lVar26 + 0x30;
        } while (uVar21 < pDVar29->header->cRegions);
      }
    }
  }
  return local_80;
}

Assistant:

Instrument *load_instrument_dls(Renderer *song, int drum, int bank, int instrument)
{
	Instrument *inst;
	DWORD i;
	DLS_Instrument *dls_ins = NULL;

	if (song->patches == NULL)
	{
		return NULL;
	}
	drum = drum ? 0x80000000 : 0;
	for (i = 0; i < song->patches->cInstruments; ++i)
	{
		dls_ins = &song->patches->instruments[i];
		if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
			((dls_ins->header->Locale.ulBank >> 8) & 0xFF) == (ULONG)bank &&
			dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
			break;
	}
	if (i == song->patches->cInstruments && bank == 0)
	{
		for (i = 0; i < song->patches->cInstruments; ++i)
		{
			dls_ins = &song->patches->instruments[i];
			if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
				dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
				break;
		}
	}
	if (i == song->patches->cInstruments)
	{
//		SNDDBG(("Couldn't find %s instrument %d in bank %d\n", drum ? "drum" : "melodic", instrument, bank));
		return NULL;
	}

	inst = (Instrument *)safe_malloc(sizeof(Instrument));
	inst->samples = dls_ins->header->cRegions;
	inst->sample = (Sample *)safe_malloc(inst->samples * sizeof(Sample));
	memset(inst->sample, 0, inst->samples * sizeof(Sample));
	/*
	printf("Found %s instrument %d in bank %d named %s with %d regions\n", drum ? "drum" : "melodic", instrument, bank, dls_ins->name, inst->samples);
	*/
	for (i = 0; i < dls_ins->header->cRegions; ++i)
	{
		load_region_dls(song, &inst->sample[i], dls_ins, i);
	}
	return inst;
}